

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::DrawSkyboxSector(GLFlat *this,int pass,bool processlights)

{
  line_t *plVar1;
  vertex_t *pvVar2;
  vertex_t *pvVar3;
  FFlatVertexBuffer *pFVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  FQuadDrawer qd;
  FQuadDrawer local_10;
  
  iVar6 = gl.buffermethod;
  lVar7 = (long)this->sector->linecount;
  if (lVar7 < 1) {
    fVar13 = 3.4028235e+38;
    fVar14 = -3.4028235e+38;
    fVar12 = -3.4028235e+38;
    fVar15 = 3.4028235e+38;
  }
  else {
    fVar12 = -3.4028235e+38;
    fVar15 = 3.4028235e+38;
    lVar8 = 0;
    fVar13 = 3.4028235e+38;
    fVar14 = -3.4028235e+38;
    do {
      plVar1 = this->sector->lines[lVar8];
      pvVar2 = plVar1->v1;
      fVar16 = (float)(pvVar2->p).X;
      pvVar3 = plVar1->v2;
      fVar17 = (float)(pvVar2->p).Y;
      if (fVar16 <= fVar15) {
        fVar15 = fVar16;
      }
      fVar18 = (float)(pvVar3->p).X;
      if (fVar12 <= fVar16) {
        fVar12 = fVar16;
      }
      fVar16 = (float)(pvVar3->p).Y;
      if (fVar17 <= fVar13) {
        fVar13 = fVar17;
      }
      if (fVar14 <= fVar17) {
        fVar14 = fVar17;
      }
      if (fVar18 <= fVar15) {
        fVar15 = fVar18;
      }
      if (fVar16 <= fVar13) {
        fVar13 = fVar16;
      }
      if (fVar12 <= fVar18) {
        fVar12 = fVar18;
      }
      if (fVar14 <= fVar16) {
        fVar14 = fVar16;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  fVar16 = (float)((double)this->dz + (this->plane).plane.negiC * (this->plane).plane.D);
  iVar5 = SUB84((double)((this->plane).Angle * 0.011111111) + 6755399441055744.0,0);
  if (gl.buffermethod == 1) {
    local_10.p = FQuadDrawer::buffer;
  }
  else {
    pFVar4 = GLRenderer->mVBO;
    local_10.ndx = pFVar4->mCurIndex;
    pFVar4->mCurIndex = local_10.ndx + 4U;
    if (0x1e828b < local_10.ndx + 4U) {
      pFVar4->mCurIndex = pFVar4->mIndex;
    }
    local_10.p = pFVar4->map + (uint)local_10.ndx;
  }
  uVar9 = (ulong)((-iVar5 & 3U) << 2);
  fVar17 = *(float *)((long)DrawSkyboxSector::uvals + uVar9);
  fVar18 = *(float *)((long)DrawSkyboxSector::vvals + uVar9);
  uVar11 = (ulong)((1U - iVar5 & 3) << 2);
  uVar10 = (ulong)((2U - iVar5 & 3) << 2);
  uVar9 = (ulong)((3U - iVar5 & 3) << 2);
  (local_10.p)->x = fVar15;
  (local_10.p)->z = fVar16;
  (local_10.p)->y = fVar13;
  (local_10.p)->u = fVar17;
  (local_10.p)->v = fVar18;
  fVar17 = *(float *)((long)DrawSkyboxSector::uvals + uVar11);
  fVar18 = *(float *)((long)DrawSkyboxSector::vvals + uVar11);
  local_10.p[1].x = fVar15;
  local_10.p[1].z = fVar16;
  local_10.p[1].y = fVar14;
  local_10.p[1].u = fVar17;
  local_10.p[1].v = fVar18;
  fVar15 = *(float *)((long)DrawSkyboxSector::uvals + uVar10);
  fVar17 = *(float *)((long)DrawSkyboxSector::vvals + uVar10);
  local_10.p[2].x = fVar12;
  local_10.p[2].z = fVar16;
  local_10.p[2].y = fVar14;
  local_10.p[2].u = fVar15;
  local_10.p[2].v = fVar17;
  fVar14 = *(float *)((long)DrawSkyboxSector::uvals + uVar9);
  fVar15 = *(float *)((long)DrawSkyboxSector::vvals + uVar9);
  local_10.p[3].x = fVar12;
  local_10.p[3].z = fVar16;
  local_10.p[3].y = fVar13;
  local_10.p[3].u = fVar14;
  local_10.p[3].v = fVar15;
  if (iVar6 == 1) {
    FQuadDrawer::DoRender(&local_10,6);
  }
  else {
    (*_ptrc_glDrawArrays)(6,local_10.ndx,4);
  }
  flatvertices = flatvertices + 4;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSkyboxSector(int pass, bool processlights)
{

	float minx = FLT_MAX, miny = FLT_MAX;
	float maxx = -FLT_MAX, maxy = -FLT_MAX;

	for (int i = 0; i < sector->linecount; i++)
	{
		line_t *ln = sector->lines[i];
		float x = ln->v1->fX();
		float y = ln->v1->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
		x = ln->v2->fX();
		y = ln->v2->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
	}

	float z = plane.plane.ZatPoint(0., 0.) + dz;
	static float uvals[] = { 0, 0, 1, 1 };
	static float vvals[] = { 1, 0, 0, 1 };
	int rot = -xs_FloorToInt(plane.Angle / 90.f);

	FQuadDrawer qd;

	qd.Set(0, minx, z, miny, uvals[rot & 3], vvals[rot & 3]);
	qd.Set(1, minx, z, maxy, uvals[(rot + 1) & 3], vvals[(rot + 1) & 3]);
	qd.Set(2, maxx, z, maxy, uvals[(rot + 2) & 3], vvals[(rot + 2) & 3]);
	qd.Set(3, maxx, z, miny, uvals[(rot + 3) & 3], vvals[(rot + 3) & 3]);
	qd.Render(GL_TRIANGLE_FAN);

	flatvertices += 4;
	flatprimitives++;
}